

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

string * show_encryption_method_abi_cxx11_
                   (string *__return_storage_ptr__,encryption_method_e method)

{
  allocator<char> local_16;
  undefined1 local_15;
  encryption_method_e local_14;
  string *psStack_10;
  encryption_method_e method_local;
  string *result;
  
  local_15 = 0;
  local_14 = method;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"unknown",&local_16);
  std::allocator<char>::~allocator(&local_16);
  switch(local_14) {
  case e_none:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"none");
    break;
  case e_unknown:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"unknown");
    break;
  case e_rc4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"RC4");
    break;
  case e_aes:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"AESv2");
    break;
  case e_aesv3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"AESv3");
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
show_encryption_method(QPDF::encryption_method_e method)
{
    std::string result = "unknown";
    switch (method) {
    case QPDF::e_none:
        result = "none";
        break;
    case QPDF::e_unknown:
        result = "unknown";
        break;
    case QPDF::e_rc4:
        result = "RC4";
        break;
    case QPDF::e_aes:
        result = "AESv2";
        break;
    case QPDF::e_aesv3:
        result = "AESv3";
        break;
        // no default so gcc will warn for missing case
    }
    return result;
}